

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O2

void __thiscall wabt::IfExceptExpr::~IfExceptExpr(IfExceptExpr *this)

{
  ~IfExceptExpr(this);
  operator_delete(this);
  return;
}

Assistant:

explicit IfExceptExpr(const Location& loc = Location())
      : ExprMixin<ExprType::IfExcept>(loc) {}